

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void run_tests(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  void *__ptr;
  long lVar5;
  undefined8 *puVar6;
  byte bVar7;
  size_t footer_len;
  uint8_t message_1 [5];
  uint8_t message [5];
  uint8_t key [32];
  long local_a0;
  int local_98;
  undefined1 local_94;
  int *local_90;
  undefined4 local_88;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined4 uStack_7e;
  undefined8 local_68 [8];
  undefined4 local_28;
  undefined1 local_24;
  undefined2 local_18;
  
  bVar7 = 0;
  nonce_override(nonce);
  cVar1 = paseto_v2_local_load_key_base64(local_68,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
  if (cVar1 == '\0') {
    __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0xf,"void test_encode(void)");
  }
  uStack_84 = 0;
  local_88 = 0x74736574;
  pcVar3 = (char *)paseto_v2_local_encrypt(&local_88,4,local_68,0,0);
  if (pcVar3 == (char *)0x0) {
    run_tests_cold_4();
LAB_00101a34:
    __assert_fail("strcmp(\"v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A\", enc) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x15,"void test_encode(void)");
  }
  printf("enc: %s\n",pcVar3);
  iVar2 = strcmp("v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A",pcVar3);
  if (iVar2 != 0) goto LAB_00101a34;
  free(pcVar3);
  cVar1 = paseto_v2_local_load_key_base64(&local_88,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
  if (cVar1 == '\0') {
    __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x1b,"void test_decode(void)");
  }
  pcVar3 = "v2.local.O8cYeF1ljNyMEFqSD0akbinLPPhDXkG0kfdwHmYhwxwxbwdeFmaH_7LwrSw";
  puVar6 = local_68;
  for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar6 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + ((ulong)bVar7 * -2 + 1) * 8;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  local_24 = 0;
  local_28 = 0x77537277;
  local_a0 = 0;
  piVar4 = (int *)paseto_v2_local_decrypt(local_68,&local_a0,&local_88,0,0);
  if (piVar4 == (int *)0x0) {
    run_tests_cold_3();
LAB_00101a77:
    __assert_fail("message_len == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x22,"void test_decode(void)");
  }
  printf("dec: %s\n",piVar4);
  if (local_a0 != 4) goto LAB_00101a77;
  if (*piVar4 != 0x74736574) {
    __assert_fail("memcmp(\"test\", message, 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x23,"void test_decode(void)");
  }
  free(piVar4);
  cVar1 = paseto_v2_local_load_key_base64(local_68,"This_is_the_key_base64url_encoded_unpadded8");
  if (cVar1 == '\0') {
    __assert_fail("paseto_v2_local_load_key_base64(key, \"This_is_the_key_base64url_encoded_unpadded8\") == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x29,"void test_encode_decode_footer(void)");
  }
  local_94 = 0;
  local_98 = 0x74736574;
  __ptr = (void *)paseto_v2_local_encrypt(&local_98,4,local_68,"foot",5);
  if (__ptr == (void *)0x0) {
    run_tests_cold_2();
  }
  else {
    printf("enc: %s\n",__ptr);
    local_88 = 0;
    uStack_84 = 0;
    uStack_83 = 0;
    uStack_82 = 0;
    local_a0 = 0;
    piVar4 = (int *)paseto_v2_local_decrypt(__ptr,&local_88,local_68,&local_90);
    if (piVar4 != (int *)0x0) {
      free(__ptr);
      printf("dec: %s footer: %s\n",piVar4,local_90);
      if (CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88))) == 4) {
        if (local_a0 != 5) {
          __assert_fail("footer_len == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x3a,"void test_encode_decode_footer(void)");
        }
        if (local_98 != *piVar4) {
          __assert_fail("memcmp(message, message_dec, message_len) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x3b,"void test_encode_decode_footer(void)");
        }
        if ((char)local_90[1] != '\0' || *local_90 != 0x746f6f66) {
          __assert_fail("memcmp(\"foot\", footer, 5) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x3c,"void test_encode_decode_footer(void)");
        }
        free(piVar4);
        cVar1 = paseto_v2_local_load_key_base64
                          (local_68,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
        if (cVar1 == '\0') {
          __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x42,"void test_decode_invalid_header(void)");
        }
        local_a0 = CONCAT26(local_a0._6_2_,0x2e00000000);
        local_a0 = CONCAT44(local_a0._4_4_,0x782e3276);
        local_88 = 0;
        uStack_84 = 0;
        uStack_83 = 0;
        uStack_82 = 0;
        lVar5 = paseto_v2_local_decrypt(&local_a0,&local_88,local_68,0,0);
        piVar4 = __errno_location();
        if (*piVar4 != 0x16) {
          __assert_fail("errno == EINVAL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x46,"void test_decode_invalid_header(void)");
        }
        if (lVar5 != 0) {
          __assert_fail("message == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x47,"void test_decode_invalid_header(void)");
        }
        cVar1 = paseto_v2_local_load_key_base64
                          (local_68,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
        if (cVar1 == '\0') {
          __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x4c,"void test_decode_invalid_message_empty(void)");
        }
        local_88 = 0x6c2e3276;
        uStack_84 = 0x6f;
        uStack_83 = 99;
        uStack_82 = 0x6c61;
        local_80 = 0x2e;
        local_a0 = 0;
        lVar5 = paseto_v2_local_decrypt(&local_88,&local_a0,local_68,0,0);
        if (*piVar4 == 0x16) {
          if (lVar5 != 0) {
            __assert_fail("message == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                          ,0x51,"void test_decode_invalid_message_empty(void)");
          }
          cVar1 = paseto_v2_local_load_key_base64
                            (local_68,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
          if (cVar1 == '\0') {
            __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                          ,0x56,"void test_decode_invalid_message_short(void)");
          }
          local_80 = 0x612e;
          uStack_7e = 0x666473;
          local_88 = 0x6c2e3276;
          uStack_84 = 0x6f;
          uStack_83 = 99;
          uStack_82 = 0x6c61;
          local_a0 = 0;
          lVar5 = paseto_v2_local_decrypt(&local_88,&local_a0,local_68,0,0);
          if (*piVar4 != 0x16) {
            __assert_fail("errno == EINVAL",
                          "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                          ,0x5a,"void test_decode_invalid_message_short(void)");
          }
          if (lVar5 == 0) {
            cVar1 = paseto_v2_local_load_key_base64
                              (&local_88,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
            if (cVar1 == '\0') {
              __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                            ,0x60,"void test_decode_invalid_message_long(void)");
            }
            pcVar3 = 
            "v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA";
            puVar6 = local_68;
            for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
              *puVar6 = *(undefined8 *)pcVar3;
              pcVar3 = pcVar3 + ((ulong)bVar7 * -2 + 1) * 8;
              puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
            }
            local_18 = 0x41;
            local_a0 = 0;
            lVar5 = paseto_v2_local_decrypt(local_68,&local_a0,&local_88,0,0);
            if (*piVar4 == 0x16) {
              if (lVar5 == 0) {
                return;
              }
              __assert_fail("message == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                            ,0x65,"void test_decode_invalid_message_long(void)");
            }
            __assert_fail("errno == EINVAL",
                          "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                          ,100,"void test_decode_invalid_message_long(void)");
          }
          __assert_fail("message == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                        ,0x5b,"void test_decode_invalid_message_short(void)");
        }
        __assert_fail("errno == EINVAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                      ,0x50,"void test_decode_invalid_message_empty(void)");
      }
      goto LAB_00101ae1;
    }
  }
  run_tests_cold_1();
LAB_00101ae1:
  __assert_fail("message_len_dec == message_len",
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                ,0x39,"void test_encode_decode_footer(void)");
}

Assistant:

static void test_encode(void) {
    nonce_override(nonce);
    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    assert(paseto_v2_local_load_key_base64(key, "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw") == true);
    const uint8_t message[] = "test";
    char *enc = paseto_v2_local_encrypt(message, 4, key, NULL, 0);
    if (!enc) perror("paseto_v2_local_encrypt failed");
    assert(enc != NULL);
    printf("enc: %s\n", enc);
    assert(strcmp("v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A", enc) == 0);
    free(enc);
}